

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O1

Sexp * Builtin_Div(Sexp *fst,Sexp *snd)

{
  double dVar1;
  Sexp *pSVar2;
  undefined8 *puVar3;
  Sexp *local_98;
  Sexp *fst_local;
  undefined8 local_88;
  undefined1 local_80 [24];
  uint64_t local_68;
  undefined1 local_60 [24];
  uint64_t local_48;
  undefined1 local_40 [24];
  Sexp *snd_local;
  FrameProtector __frame_prot;
  
  local_98 = fst;
  local_40._16_8_ = snd;
  FrameProtector::FrameProtector((FrameProtector *)&snd_local,"Builtin_Div");
  FrameProtector::ProtectValue((FrameProtector *)&snd_local,&local_98,"fst");
  FrameProtector::ProtectValue((FrameProtector *)&snd_local,(Sexp **)(local_40 + 0x10),"snd");
  if (local_98->kind != FIXNUM) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
    fst_local = (Sexp *)local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&fst_local,"type error: not a fixnum","");
    *puVar3 = &PTR__JetRuntimeException_00126918;
    puVar3[1] = puVar3 + 3;
    if (fst_local == (Sexp *)local_80) {
      puVar3[3] = CONCAT71(local_80._1_7_,local_80[0]);
      puVar3[4] = local_80._8_8_;
    }
    else {
      puVar3[1] = fst_local;
      puVar3[3] = CONCAT71(local_80._1_7_,local_80[0]);
    }
    puVar3[2] = local_88;
    local_88 = 0;
    local_80[0] = EMPTY;
    fst_local = (Sexp *)local_80;
    __cxa_throw(puVar3,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  if (*(Kind *)local_40._16_8_ == FIXNUM) {
    dVar1 = ((anon_union_16_11_d0fa9a51_for_Sexp_2 *)(local_40._16_8_ + 8))->fixnum_value;
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_60._16_8_ = (Sexp *)local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_60 + 0x10),"divided by zero","");
      *puVar3 = &PTR__JetRuntimeException_00126918;
      puVar3[1] = puVar3 + 3;
      if ((Sexp *)local_60._16_8_ == (Sexp *)local_40) {
        puVar3[3] = CONCAT71(local_40._1_7_,local_40[0]);
        puVar3[4] = local_40._8_8_;
      }
      else {
        puVar3[1] = local_60._16_8_;
        puVar3[3] = CONCAT71(local_40._1_7_,local_40[0]);
      }
      puVar3[2] = local_48;
      local_48 = 0;
      local_40[0] = EMPTY;
      local_60._16_8_ = (Sexp *)local_40;
      __cxa_throw(puVar3,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
    }
    pSVar2 = GcHeap::AllocateFixnum((local_98->field_1).fixnum_value / dVar1);
    FrameProtector::~FrameProtector((FrameProtector *)&snd_local);
    return pSVar2;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_80._16_8_ = (Sexp *)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),"type error: not a fixnum","");
  *puVar3 = &PTR__JetRuntimeException_00126918;
  puVar3[1] = puVar3 + 3;
  if ((Sexp *)local_80._16_8_ == (Sexp *)local_60) {
    puVar3[3] = CONCAT71(local_60._1_7_,local_60[0]);
    puVar3[4] = local_60._8_8_;
  }
  else {
    puVar3[1] = local_80._16_8_;
    puVar3[3] = CONCAT71(local_60._1_7_,local_60[0]);
  }
  puVar3[2] = local_68;
  local_68 = 0;
  local_60[0] = EMPTY;
  local_80._16_8_ = (Sexp *)local_60;
  __cxa_throw(puVar3,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
}

Assistant:

Sexp *Builtin_Div(Sexp *fst, Sexp *snd) {
  GC_HELPER_FRAME;
  GC_PROTECT(fst);
  GC_PROTECT(snd);

  if (!fst->IsFixnum()) {
    throw JetRuntimeException("type error: not a fixnum");
  }

  if (!snd->IsFixnum()) {
    throw JetRuntimeException("type error: not a fixnum");
  }

  if (snd->fixnum_value == 0) {
    throw JetRuntimeException("divided by zero");
  }

  return GcHeap::AllocateFixnum(fst->fixnum_value / snd->fixnum_value);
}